

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omnidir_model.hpp
# Opt level: O2

double __thiscall
OmnidirModel::computeReprojectionErrors
          (OmnidirModel *this,
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          *object_points_list,
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          *image_points_list,vector<cv::Mat,_std::allocator<cv::Mat>_> *rvecs,
          vector<cv::Mat,_std::allocator<cv::Mat>_> *tvecs,Mat *idx,Mat *camera_matrix,Mat *xi,
          Mat *distort_coeffs,vector<double,_std::allocator<double>_> *image_reproj_errors)

{
  pointer pvVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  _OutputArray *p_Var5;
  _InputArray *p_Var6;
  int iVar7;
  int i0;
  double dVar8;
  double dVar9;
  int local_19c;
  double local_198;
  _InputArray local_188;
  _InputArray local_170;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points2;
  _InputArray local_120;
  _InputArray local_108;
  undefined1 local_f0 [16];
  uchar *local_e0;
  undefined1 local_90 [16];
  uchar *local_80;
  
  image_points2.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  image_points2.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  image_points2.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (image_reproj_errors,
             ((long)(object_points_list->
                    super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(object_points_list->
                   super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  i0 = 0;
  local_198 = 0.0;
  local_19c = 0;
  while( true ) {
    iVar2 = cv::Mat::total();
    if (iVar2 <= i0) break;
    piVar3 = cv::Mat::at<int>(idx,i0);
    iVar2 = *piVar3;
    local_90._8_8_ =
         (object_points_list->
         super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + iVar2;
    local_80 = (uchar *)0x0;
    local_90._0_4_ = -0x7efcffeb;
    local_e0 = (uchar *)0x0;
    local_f0._0_4_ = -0x7dfcfff3;
    local_f0._8_8_ = &image_points2;
    local_170.obj =
         (rvecs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start + iVar2;
    local_170.sz.width = 0;
    local_170.sz.height = 0;
    local_170.flags = 0x1010000;
    local_188.obj =
         (tvecs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start + iVar2;
    local_188.sz.width = 0;
    local_188.sz.height = 0;
    local_108.sz.width = 0;
    local_108.sz.height = 0;
    local_188.flags = 0x1010000;
    local_108.flags = 0x1010000;
    local_108.obj = camera_matrix;
    pdVar4 = cv::Mat::at<double>(xi,0);
    dVar8 = *pdVar4;
    local_120.sz.width = 0;
    local_120.sz.height = 0;
    local_120.flags = 0x1010000;
    local_120.obj = distort_coeffs;
    p_Var5 = (_OutputArray *)cv::noArray();
    cv::omnidir::projectPoints
              ((_InputArray *)local_90,(_OutputArray *)local_f0,&local_170,&local_188,&local_108,
               dVar8,&local_120,p_Var5);
    cv::Mat::Mat<cv::Point_<float>>
              ((Mat *)local_90,
               (image_points_list->
               super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + iVar2,false);
    local_170.sz.width = 0;
    local_170.sz.height = 0;
    local_170.flags = 0x1010000;
    local_170.obj = (Mat *)local_90;
    cv::Mat::Mat<cv::Point_<float>>((Mat *)local_f0,&image_points2,false);
    local_188.sz.width = 0;
    local_188.sz.height = 0;
    local_188.flags = 0x1010000;
    local_188.obj = (Mat *)local_f0;
    p_Var6 = (_InputArray *)cv::noArray();
    dVar8 = (double)cv::norm(&local_170,&local_188,4,p_Var6);
    cv::Mat::~Mat((Mat *)local_f0);
    cv::Mat::~Mat((Mat *)local_90);
    pvVar1 = (object_points_list->
             super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar7 = (int)(((long)*(pointer *)
                          ((long)&pvVar1[iVar2].
                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                  *(long *)&pvVar1[iVar2].
                            super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                            ._M_impl.super__Vector_impl_data) / 0xc);
    dVar9 = (dVar8 * dVar8) / (double)iVar7;
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    (image_reproj_errors->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[iVar2] = dVar9;
    local_198 = local_198 + dVar8 * dVar8;
    local_19c = local_19c + iVar7;
    i0 = i0 + 1;
  }
  local_198 = local_198 / (double)local_19c;
  if (local_198 < 0.0) {
    local_198 = sqrt(local_198);
  }
  else {
    local_198 = SQRT(local_198);
  }
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&image_points2.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  return local_198;
}

Assistant:

double computeReprojectionErrors(
    const std::vector<std::vector<cv::Point3f>>& object_points_list,
    const std::vector<std::vector<cv::Point2f>>& image_points_list,
    const std::vector<cv::Mat>& rvecs,
    const std::vector<cv::Mat>& tvecs,
    const cv::Mat& idx,
    const cv::Mat& camera_matrix,
    const cv::Mat& xi,
    const cv::Mat& distort_coeffs,
    std::vector<double>& image_reproj_errors
  ) {
    std::vector<cv::Point2f> image_points2;
    int total_points = 0;
    double total_error = 0;
    
    image_reproj_errors.resize(object_points_list.size());
    for (int k = 0;  k < (int)idx.total(); ++k) {
      int i = idx.at<int>(k);
      cv::omnidir::projectPoints(
	object_points_list[i],
	image_points2,
	rvecs[i],
	tvecs[i],
	camera_matrix,
	xi.at<double>(0),
	distort_coeffs
      );
      
      double err = cv::norm(
	cv::Mat(image_points_list[i]),
	cv::Mat(image_points2),
	cv::NORM_L2
      );
      int n = (int)object_points_list[i].size();
      image_reproj_errors[i] = (double)std::sqrt(err*err/n);
      total_error += err*err;
      total_points += n;
    }

    return std::sqrt(total_error/total_points);
  }